

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_critbit.c
# Opt level: O0

void test_insert_reverse(CuTest *tc)

{
  int iVar1;
  char *pcVar2;
  char *str;
  int result;
  critbit_tree cb;
  CuTest *tc_local;
  
  cb.root = tc;
  memset(&stack0xffffffffffffffe8,0,8);
  iVar1 = cb_insert((critbit_tree *)&stack0xffffffffffffffe8,"herp",5);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x42,(char *)0x0,0,iVar1);
  iVar1 = cb_insert((critbit_tree *)&stack0xffffffffffffffe8,"hurp",5);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x44,(char *)0x0,0,iVar1);
  iVar1 = cb_insert((critbit_tree *)&stack0xffffffffffffffe8,"derp",5);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x46,(char *)0x0,0,iVar1);
  pcVar2 = (char *)cb_find((critbit_tree *)&stack0xffffffffffffffe8,"herp",5);
  CuAssertStrEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x49,(char *)0x0,"herp",pcVar2);
  pcVar2 = (char *)cb_find((critbit_tree *)&stack0xffffffffffffffe8,"derp",5);
  CuAssertStrEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x4b,(char *)0x0,"derp",pcVar2);
  pcVar2 = (char *)cb_find((critbit_tree *)&stack0xffffffffffffffe8,"hurp",5);
  CuAssertStrEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x4d,(char *)0x0,"hurp",pcVar2);
  cb_clear((critbit_tree *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

static void test_insert_reverse(CuTest * tc)
{
  critbit_tree cb = CRITBIT_TREE();
  int result;
  const char * str;

  result = cb_insert_str(&cb, "herp");
  CuAssertIntEquals(tc, CB_SUCCESS, result);
  result = cb_insert_str(&cb, "hurp");
  CuAssertIntEquals(tc, CB_SUCCESS, result);
  result = cb_insert_str(&cb, "derp");
  CuAssertIntEquals(tc, CB_SUCCESS, result);

  str = cb_find_str(&cb, "herp");
  CuAssertStrEquals(tc, "herp", str);
  str = cb_find_str(&cb, "derp");
  CuAssertStrEquals(tc, "derp", str);
  str = cb_find_str(&cb, "hurp");
  CuAssertStrEquals(tc, "hurp", str);

  cb_clear(&cb);
}